

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  TerminalExpression *this;
  TerminalExpression *this_00;
  NonTerminalExpression *this_01;
  NonTerminalExpression *this_02;
  NonTerminalExpression *this_03;
  char *__assertion;
  allocator local_e9;
  Context context;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  context.vars._M_h._M_buckets = &context.vars._M_h._M_single_bucket;
  context.vars._M_h._M_bucket_count = 1;
  context.vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  context.vars._M_h._M_element_count = 0;
  context.vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  context.vars._M_h._M_rehash_policy._M_next_resize = 0;
  context.vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&local_50,"CAT",&local_e9);
  Context::set(&context,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"DOG",&local_e9);
  Context::set(&context,&local_70,true);
  std::__cxx11::string::~string((string *)&local_70);
  this = (TerminalExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_90,"CAT",&local_e9);
  TerminalExpression::TerminalExpression(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  this_00 = (TerminalExpression *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_b0,"DOG",&local_e9);
  TerminalExpression::TerminalExpression(this_00,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  this_01 = (NonTerminalExpression *)operator_new(0x18);
  (this_01->super_AbstractExpression)._vptr_AbstractExpression =
       (_func_int **)&PTR_interpret_00103da8;
  this_01->left = (AbstractExpression *)this;
  this_01->right = (AbstractExpression *)this;
  this_02 = (NonTerminalExpression *)operator_new(0x18);
  (this_02->super_AbstractExpression)._vptr_AbstractExpression =
       (_func_int **)&PTR_interpret_00103da8;
  this_02->left = (AbstractExpression *)this;
  this_02->right = (AbstractExpression *)this_00;
  this_03 = (NonTerminalExpression *)operator_new(0x18);
  (this_03->super_AbstractExpression)._vptr_AbstractExpression =
       (_func_int **)&PTR_interpret_00103da8;
  this_03->left = (AbstractExpression *)this_00;
  this_03->right = (AbstractExpression *)this_00;
  bVar1 = NonTerminalExpression::interpret(this_01,&context);
  bVar2 = NonTerminalExpression::interpret(this_02,&context);
  bVar3 = NonTerminalExpression::interpret(this_03,&context);
  if (bVar1) {
    __assertion = "exper1 == false";
    __line = 0x16;
  }
  else if (bVar2) {
    __assertion = "exper2 == false";
    __line = 0x17;
  }
  else {
    if (bVar3) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&context);
      return 0;
    }
    __assertion = "exper3 == true";
    __line = 0x18;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/interpreter_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  Context context;

  context.set("CAT", false);
  context.set("DOG", true);

  AbstractExpression *cat = new TerminalExpression("CAT");
  AbstractExpression *dog = new TerminalExpression("DOG");
  AbstractExpression *cat_and_cat = new NonTerminalExpression(cat, cat);
  AbstractExpression *cat_and_dog = new NonTerminalExpression(cat, dog);
  AbstractExpression *dog_and_dog = new NonTerminalExpression(dog, dog);

  bool exper1 = cat_and_cat->interpret(&context);
  bool exper2 = cat_and_dog->interpret(&context);
  bool exper3 = dog_and_dog->interpret(&context);
  assert(exper1 == false);
  assert(exper2 == false);
  assert(exper3 == true);
}